

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O0

var cs_impl::fiber::await<cs_impl::runtime_cs_ext::async_callable>(async_callable *func)

{
  future_status fVar1;
  routine_t rVar2;
  proxy *in_RDI;
  async_callable *unaff_retaddr;
  launch in_stack_0000000c;
  future_status status;
  future<cs_impl::any> future;
  thread_guard guard;
  undefined4 in_stack_ffffffffffffff88;
  future_status in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_54;
  duration<long,std::ratio<1l,1000l>> local_50 [8];
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  duration<long,std::ratio<1l,1000l>> local_40 [8];
  future_status local_38;
  
  cs::thread_guard::thread_guard((thread_guard *)0x25c355);
  std::async<cs_impl::runtime_cs_ext::async_callable&>(in_stack_0000000c,unaff_retaddr);
  iVar3 = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_40,(int *)&stack0xffffffffffffffbc);
  fVar1 = std::__basic_future<cs_impl::any>::wait_for<long,std::ratio<1l,1000l>>
                    ((__basic_future<cs_impl::any> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38 = fVar1;
  while (local_38 == timeout) {
    rVar2 = current();
    if (rVar2 != 0) {
      yield();
    }
    local_54 = 0;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_50,&local_54);
    in_stack_ffffffffffffff8c =
         std::__basic_future<cs_impl::any>::wait_for<long,std::ratio<1l,1000l>>
                   ((__basic_future<cs_impl::any> *)CONCAT44(fVar1,rVar2),
                    (duration<long,_std::ratio<1L,_1000L>_> *)
                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_38 = in_stack_ffffffffffffff8c;
  }
  std::future<cs_impl::any>::get((future<cs_impl::any> *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
  std::future<cs_impl::any>::~future((future<cs_impl::any> *)0x25c44c);
  cs::thread_guard::~thread_guard((thread_guard *)0x25c456);
  return (var)in_RDI;
}

Assistant:

inline cs::var await(Function &&func)
		{
			cs::thread_guard guard;
			auto future = std::async(std::launch::async, func);
			std::future_status status = future.wait_for(std::chrono::milliseconds(0));

			while (status == std::future_status::timeout) {
				if (current() != 0)
					yield();

				status = future.wait_for(std::chrono::milliseconds(0));
			}
			return future.get();
		}